

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_terminate(void)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (GAinitialized == '\x01') {
    lVar3 = 0;
    sai_terminate_sparse_arrays();
    for (lVar2 = -1000; uVar1 = (ulong)_max_global_array, lVar2 + 1000 < (long)uVar1;
        lVar2 = lVar2 + 1) {
      if (*(int *)((long)GA->dims + lVar3 + -0x28) != 0) {
        pnga_destroy(lVar2);
      }
      free(*(void **)(GA->name + lVar3 + -0x10));
      free(*(void **)(GA->name + lVar3 + -8));
      lVar3 = lVar3 + 0x368;
    }
    lVar2 = 0x10;
    for (lVar3 = 0; lVar3 < (int)uVar1; lVar3 = lVar3 + 1) {
      if (*(int *)((long)PGRP_LIST + lVar2 + -8) != 0) {
        free(*(void **)((long)&PGRP_LIST->mirrored + lVar2));
        uVar1 = (ulong)(uint)_max_global_array;
      }
      lVar2 = lVar2 + 0x28;
    }
    pnga_sync();
    GA_total_memory = -1;
    GA_memory_limited = 0;
    gai_finalize_onesided();
    free(mapALL);
    free(_ga_main_data_structure);
    free(_proc_list_main_data_structure);
    ARMCI_Free(GA_Update_Flags[GAme]);
    free(GA_Update_Flags);
    ARMCI_Free_local(GA_Update_Signal);
    pnga_sync();
    ARMCI_Finalize();
    MPI_Comm_free(&GA_MPI_World_comm_dup);
    ARMCIinitialized = 0;
    GAinitialized = '\0';
  }
  return;
}

Assistant:

void pnga_terminate() 
{
    //GA_Internal_Threadsafe_Lock();
Integer i, handle;

    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if(!GAinitialized)
    {
        //GA_Internal_Threadsafe_Unlock();
        return;
    }

    sai_terminate_sparse_arrays();
#ifdef PROFILE_OLD 
    ga_profile_terminate();
#endif
    for (i=0;i<_max_global_array;i++){
          handle = i - GA_OFFSET ;
          if(GA[i].actv) pnga_destroy(handle);
          if(GA[i].ptr) free(GA[i].ptr);
          if(GA[i].mapc) free(GA[i].mapc);
    }
    /* don't free groups list until all arrays destroyed */
    for (i=0;i<_max_global_array;i++){
          if(PGRP_LIST[i].actv) free(PGRP_LIST[i].map_proc_list);
    }
    pnga_sync();

    GA_total_memory = -1; /* restore "unlimited" memory usage status */
    GA_memory_limited = 0;
    gai_finalize_onesided();
    free(mapALL);
    free(_ga_main_data_structure);
    free(_proc_list_main_data_structure);
    ARMCI_Free(GA_Update_Flags[GAme]);
    free(GA_Update_Flags);
    ARMCI_Free_local(GA_Update_Signal);

    pnga_sync();
    ARMCI_Finalize();
#ifdef MSG_COMMS_MPI
    MPI_Comm_free(&GA_MPI_World_comm_dup);
#endif
    ARMCIinitialized = 0;
    GAinitialized = 0;
    //GA_Internal_Threadsafe_Unlock();
}